

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O1

Vec_Wrd_t * Gia_ManComputeTruths(Gia_Man_t *p,int nCutSize,int nLutNum,int fReverse)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  word wVar3;
  uint uVar4;
  Vec_Wrd_t *pVVar5;
  word *pwVar6;
  word *pwVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  Vec_Int_t vLeaves;
  Vec_Int_t local_58;
  ulong local_48;
  Gia_Man_t *local_40;
  long local_38;
  
  bVar8 = (char)nCutSize - 6;
  uVar11 = 1 << (bVar8 & 0x1f);
  pwVar6 = (word *)0x0;
  if (nCutSize < 7) {
    uVar11 = 1;
    bVar8 = 0;
  }
  iVar22 = nLutNum << (bVar8 & 0x1f);
  pVVar5 = (Vec_Wrd_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar22 - 1U) {
    iVar9 = iVar22;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar9;
  if (iVar9 != 0) {
    pwVar6 = (word *)malloc((long)iVar9 << 3);
  }
  pVVar5->pArray = pwVar6;
  Gia_ObjComputeTruthTableStart(p,nCutSize);
  if (1 < p->nObjs) {
    lVar21 = 1;
    local_40 = p;
    do {
      pVVar1 = p->vMapping;
      if (pVVar1->nSize <= lVar21) goto LAB_006ace84;
      piVar2 = pVVar1->pArray;
      uVar19 = piVar2[lVar21];
      if ((ulong)uVar19 != 0) {
        if (((int)uVar19 < 0) || (pVVar1->nSize <= (int)uVar19)) {
LAB_006ace84:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        local_58.nCap = piVar2[uVar19];
        uVar10 = (ulong)(uint)local_58.nCap;
        local_58.nSize = local_58.nCap;
        if (pVVar1->nSize <= lVar21) goto LAB_006ace84;
        lVar14 = (long)piVar2[lVar21];
        if ((lVar14 < 0) || (pVVar1->nSize <= piVar2[lVar21])) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        local_58.pArray = piVar2 + lVar14 + 1;
        piVar16 = piVar2 + lVar14 + 2;
        if (0 < local_58.nCap) {
          uVar17 = 0;
          uVar15 = uVar10;
          do {
            uVar15 = uVar15 - 1;
            uVar18 = uVar17 + 1;
            if (uVar18 < uVar10) {
              uVar20 = 0;
              do {
                if (local_58.pArray[uVar17] == piVar16[uVar20]) {
                  __assert_fail("Vec_IntCheckUniqueSmall(&vLeaves)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                                ,0x99,"Vec_Wrd_t *Gia_ManComputeTruths(Gia_Man_t *, int, int, int)")
                  ;
                }
                uVar20 = uVar20 + 1;
              } while (uVar15 != uVar20);
            }
            piVar16 = piVar16 + 1;
            uVar17 = uVar18;
          } while (uVar18 != uVar10);
        }
        if (1 < local_58.nCap) {
          uVar17 = 1;
          uVar15 = 0;
          do {
            uVar20 = uVar15 & 0xffffffff;
            uVar18 = uVar17;
            do {
              uVar19 = (uint)uVar18;
              if (local_58.pArray[(int)(uint)uVar20] <= piVar2[lVar14 + uVar18 + 1]) {
                uVar19 = (uint)uVar20;
              }
              uVar18 = uVar18 + 1;
              uVar20 = (ulong)uVar19;
            } while (uVar10 != uVar18);
            iVar9 = local_58.pArray[uVar15];
            local_58.pArray[uVar15] = local_58.pArray[(int)uVar19];
            uVar15 = uVar15 + 1;
            local_58.pArray[(int)uVar19] = iVar9;
            uVar17 = uVar17 + 1;
          } while (uVar15 != local_58.nCap - 1);
        }
        if (1 < local_58.nCap && fReverse == 0) {
          iVar9 = -1;
          lVar14 = 0;
          do {
            iVar22 = local_58.pArray[lVar14];
            local_58.pArray[lVar14] = local_58.pArray[local_58.nCap + iVar9];
            local_58.pArray[local_58.nCap + iVar9] = iVar22;
            lVar14 = lVar14 + 1;
            iVar9 = iVar9 + -1;
          } while (lVar14 < local_58.nCap / 2);
        }
        if (p->nObjs <= lVar21) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pwVar6 = Gia_ObjComputeTruthTableCut(p,p->pObjs + lVar21,&local_58);
        if (0 < (int)uVar11) {
          uVar19 = pVVar5->nSize;
          uVar10 = (ulong)uVar19;
          uVar12 = pVVar5->nCap;
          uVar15 = 0;
          local_48 = uVar10;
          local_38 = lVar21;
          do {
            wVar3 = pwVar6[uVar15];
            uVar4 = uVar12;
            if ((int)uVar10 + (int)uVar15 == uVar12) {
              if ((int)uVar12 < 0x10) {
                if (pVVar5->pArray == (word *)0x0) {
                  pwVar7 = (word *)malloc(0x80);
                }
                else {
                  pwVar7 = (word *)realloc(pVVar5->pArray,0x80);
                }
                pVVar5->pArray = pwVar7;
                uVar13 = 0x10;
              }
              else {
                uVar13 = uVar12 * 2;
                if ((int)uVar13 <= (int)uVar12) goto LAB_006acdd8;
                if (pVVar5->pArray == (word *)0x0) {
                  pwVar7 = (word *)malloc((ulong)uVar13 << 3);
                }
                else {
                  pwVar7 = (word *)realloc(pVVar5->pArray,(ulong)uVar13 << 3);
                }
                pVVar5->pArray = pwVar7;
              }
              uVar10 = local_48;
              uVar4 = uVar13;
              if (pwVar7 == (word *)0x0) {
                pVVar5->nSize = (int)local_48 + (int)uVar15;
                pVVar5->nCap = uVar12;
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                              ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
              }
            }
LAB_006acdd8:
            uVar12 = uVar4;
            pVVar5->pArray[(long)(int)uVar19 + uVar15] = wVar3;
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
          pVVar5->nSize = (int)uVar15 + (int)uVar10;
          pVVar5->nCap = uVar12;
          lVar21 = local_38;
          p = local_40;
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < p->nObjs);
  }
  Gia_ObjComputeTruthTableStop(p);
  if ((pVVar5->nCap != 0x10) && (pVVar5->nSize != pVVar5->nCap)) {
    __assert_fail("Vec_WrdCap(vTruths) == 16 || Vec_WrdSize(vTruths) == Vec_WrdCap(vTruths)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                  ,0xa4,"Vec_Wrd_t *Gia_ManComputeTruths(Gia_Man_t *, int, int, int)");
  }
  return pVVar5;
}

Assistant:

Vec_Wrd_t * Gia_ManComputeTruths( Gia_Man_t * p, int nCutSize, int nLutNum, int fReverse )
{
    Vec_Wrd_t * vTruths;
    Vec_Int_t vLeaves;
    word * pTruth;
    int i, k, nWords;
    nWords = Abc_Truth6WordNum( nCutSize );
    vTruths = Vec_WrdAlloc( nWords * nLutNum );
    Gia_ObjComputeTruthTableStart( p, nCutSize );
    Gia_ManForEachLut( p, i )
    {
        // collect and sort fanins
        vLeaves.nCap = vLeaves.nSize = Gia_ObjLutSize( p, i );
        vLeaves.pArray = Gia_ObjLutFanins( p, i );
        assert( Vec_IntCheckUniqueSmall(&vLeaves) );
        Vec_IntSelectSort( Vec_IntArray(&vLeaves), Vec_IntSize(&vLeaves) );
        if ( !fReverse )
            Vec_IntReverseOrder( &vLeaves );
        // compute truth table
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, i), &vLeaves );
        for ( k = 0; k < nWords; k++ )
            Vec_WrdPush( vTruths, pTruth[k] );
//        Kit_DsdPrintFromTruth( (unsigned *)pTruth, 6 ); printf( "\n" );
    }
    Gia_ObjComputeTruthTableStop( p );
    assert( Vec_WrdCap(vTruths) == 16 || Vec_WrdSize(vTruths) == Vec_WrdCap(vTruths) );
    return vTruths;
}